

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transition.hpp
# Opt level: O3

bool __thiscall
peach::transition::
MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<'a',_'z'>,_peach::transition::RangeCharTransitionTemplate<'A',_'Z'>_>,_peach::transition::SingleCharTransitionTemplate<'_'>_>,_peach::transition::RangeCharTransitionTemplate<'0',_'9'>_>
::isActive(MergeTransitions<peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>
           *this,char c)

{
  int iVar1;
  
  iVar1 = (**(this->subtransitions_).
             super__Tuple_impl<0UL,_peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>
             .
             super__Head_base<0UL,_peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_false>
             ._M_head_impl.super_CharTransition._vptr_CharTransition)
                    (&(this->subtransitions_).
                      super__Tuple_impl<0UL,_peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>
                      .
                      super__Head_base<0UL,_peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_false>
                    );
  if ((char)iVar1 != '\0') {
    return true;
  }
  iVar1 = (**(this->subtransitions_).
             super__Tuple_impl<0UL,_peach::transition::MergeTransitions<peach::transition::MergeTransitions<peach::transition::RangeCharTransitionTemplate<_a_,__z_>,_peach::transition::RangeCharTransitionTemplate<_A_,__Z_>_>,_peach::transition::SingleCharTransitionTemplate<___>_>,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>
             .super__Tuple_impl<1UL,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>_>.
             super__Head_base<1UL,_peach::transition::RangeCharTransitionTemplate<_0_,__9_>,_false>.
             _M_head_impl.super_RangeCharTransition.super_CharTransition._vptr_CharTransition)
                    (&this->subtransitions_,(ulong)(uint)(int)c);
  return SUB41(iVar1,0);
}

Assistant:

bool isActive(char c) override
    {
        return std::apply(
            [&](TransitionClasses &... transitions) {
                return (... || transitions.isActive(c));
            },
            subtransitions_);
    }